

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::constrainedfacets(tetgenmesh *this)

{
  ulong uVar1;
  uint *puVar2;
  tetrahedron *pppdVar3;
  uint uVar4;
  char **ppcVar5;
  arraypool *paVar6;
  tetrahedron *pppdVar7;
  arraypool *botshells;
  arraypool *botnewtets;
  bool bVar8;
  bool bVar9;
  int i;
  interresult iVar10;
  arraypool *crosstets;
  arraypool *topfaces;
  arraypool *toppoints;
  arraypool *botpoints;
  arraypool *this_00;
  arraypool *paVar11;
  arraypool *paVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  tetrahedron ppdVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  tetrahedron *pppdVar22;
  face *pfVar23;
  face searchsh;
  triface searchtet;
  triface crossedge;
  arraypool *paVar24;
  face local_c8;
  arraypool *local_b8;
  arraypool *local_b0;
  arraypool *local_a8;
  arraypool *local_a0;
  triface local_98;
  arraypool *local_88;
  arraypool *local_80;
  arraypool *local_78;
  ulong local_70;
  arraypool *local_68;
  arraypool *local_60;
  triface local_58;
  char ***local_48;
  face *local_40;
  char ***local_38;
  
  local_98.tet = (tetrahedron *)0x0;
  local_98.ver = 0;
  local_58.tet = (tetrahedron *)0x0;
  local_58.ver = 0;
  local_c8.sh = (shellface *)0x0;
  local_c8.shver = 0;
  crosstets = (arraypool *)operator_new(0x30);
  crosstets->objectbytes = 0x10;
  crosstets->objectsperblock = 0x400;
  crosstets->log2objectsperblock = 10;
  crosstets->objectsperblockmark = 0x3ff;
  crosstets->toparraylen = 0;
  crosstets->toparray = (char **)0x0;
  crosstets->objects = 0;
  crosstets->totalmemory = 0;
  local_80 = (arraypool *)operator_new(0x30);
  local_80->objectbytes = 0x10;
  local_80->objectsperblock = 0x400;
  local_80->log2objectsperblock = 10;
  local_80->objectsperblockmark = 0x3ff;
  local_80->toparraylen = 0;
  local_80->toparray = (char **)0x0;
  local_80->objects = 0;
  local_80->totalmemory = 0;
  local_60 = (arraypool *)operator_new(0x30);
  local_60->objectbytes = 0x10;
  local_60->objectsperblock = 0x400;
  local_60->log2objectsperblock = 10;
  local_60->objectsperblockmark = 0x3ff;
  local_60->toparraylen = 0;
  local_60->toparray = (char **)0x0;
  local_60->objects = 0;
  local_60->totalmemory = 0;
  topfaces = (arraypool *)operator_new(0x30);
  topfaces->objectbytes = 0x10;
  topfaces->objectsperblock = 0x400;
  topfaces->log2objectsperblock = 10;
  topfaces->objectsperblockmark = 0x3ff;
  topfaces->toparraylen = 0;
  topfaces->toparray = (char **)0x0;
  topfaces->objects = 0;
  topfaces->totalmemory = 0;
  local_a8 = (arraypool *)operator_new(0x30);
  local_a8->objectbytes = 0x10;
  local_a8->objectsperblock = 0x400;
  local_a8->log2objectsperblock = 10;
  local_a8->objectsperblockmark = 0x3ff;
  local_a8->toparraylen = 0;
  local_a8->toparray = (char **)0x0;
  local_a8->objects = 0;
  local_a8->totalmemory = 0;
  local_88 = (arraypool *)operator_new(0x30);
  local_88->objectbytes = 0x10;
  local_88->objectsperblock = 0x400;
  local_88->log2objectsperblock = 10;
  local_88->objectsperblockmark = 0x3ff;
  local_88->toparraylen = 0;
  local_88->toparray = (char **)0x0;
  local_88->objects = 0;
  local_88->totalmemory = 0;
  toppoints = (arraypool *)operator_new(0x30);
  toppoints->objectbytes = 8;
  toppoints->objectsperblock = 0x100;
  toppoints->log2objectsperblock = 8;
  toppoints->objectsperblockmark = 0xff;
  toppoints->toparraylen = 0;
  toppoints->toparray = (char **)0x0;
  toppoints->objects = 0;
  toppoints->totalmemory = 0;
  botpoints = (arraypool *)operator_new(0x30);
  botpoints->objectbytes = 8;
  botpoints->objectsperblock = 0x100;
  botpoints->log2objectsperblock = 8;
  botpoints->objectsperblockmark = 0xff;
  botpoints->toparraylen = 0;
  botpoints->toparray = (char **)0x0;
  botpoints->objects = 0;
  botpoints->totalmemory = 0;
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 0x10;
  this_00->objectsperblock = 0x400;
  this_00->log2objectsperblock = 10;
  this_00->objectsperblockmark = 0x3ff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  local_b0 = (arraypool *)operator_new(0x30);
  local_b0->objectbytes = 0x10;
  local_b0->objectsperblock = 0x400;
  local_b0->log2objectsperblock = 10;
  local_b0->objectsperblockmark = 0x3ff;
  local_b0->toparraylen = 0;
  local_b0->toparray = (char **)0x0;
  local_b0->objects = 0;
  local_b0->totalmemory = 0;
  local_68 = (arraypool *)operator_new(0x30);
  local_68->objectbytes = 0x10;
  local_68->objectsperblock = 0x400;
  local_68->log2objectsperblock = 10;
  local_68->objectsperblockmark = 0x3ff;
  local_68->toparraylen = 0;
  local_68->toparray = (char **)0x0;
  local_68->objects = 0;
  local_68->totalmemory = 0;
  local_78 = (arraypool *)operator_new(0x30);
  local_78->objectbytes = 0x10;
  local_78->objectsperblock = 0x400;
  local_78->log2objectsperblock = 10;
  local_78->objectsperblockmark = 0x3ff;
  local_78->toparraylen = 0;
  local_78->toparray = (char **)0x0;
  local_78->objects = 0;
  local_78->totalmemory = 0;
  local_a0 = (arraypool *)operator_new(0x30);
  local_a0->objectbytes = 0x10;
  local_a0->objectsperblock = 0x400;
  local_a0->log2objectsperblock = 10;
  local_a0->objectsperblockmark = 0x3ff;
  local_a0->toparraylen = 0;
  local_a0->toparray = (char **)0x0;
  local_a0->objects = 0;
  local_a0->totalmemory = 0;
  paVar11 = (arraypool *)operator_new(0x30);
  paVar11->objectbytes = 8;
  paVar11->objectsperblock = 0x100;
  paVar11->log2objectsperblock = 8;
  paVar11->objectsperblockmark = 0xff;
  paVar11->toparraylen = 0;
  paVar11->toparray = (char **)0x0;
  paVar11->objects = 0;
  paVar11->totalmemory = 0;
  paVar12 = (arraypool *)operator_new(0x30);
  paVar12->objectbytes = 0x10;
  paVar12->objectsperblock = 0x10;
  paVar12->log2objectsperblock = 4;
  paVar12->objectsperblockmark = 0xf;
  paVar12->toparraylen = 0;
  paVar12->toparray = (char **)0x0;
  paVar12->objects = 0;
  local_70 = 0;
  paVar12->totalmemory = 0;
  this->encseglist = paVar12;
  paVar12 = this->subfacstack;
  uVar15 = paVar12->objects;
  local_b8 = paVar11;
  if (0 < (long)uVar15) {
    local_48 = &this_00->toparray;
    local_38 = &paVar11->toparray;
    local_40 = &this->recentsh;
    do {
      while( true ) {
        uVar1 = uVar15 - 1;
        lVar18 = (uVar1 & (long)paVar12->objectsperblockmark) * (long)paVar12->objectbytes;
        local_c8.sh = *(shellface **)
                       (paVar12->toparray
                        [(long)uVar1 >> ((byte)paVar12->log2objectsperblock & 0x3f)] + lVar18);
        local_c8.shver =
             *(int *)(paVar12->toparray[(long)uVar1 >> ((byte)paVar12->log2objectsperblock & 0x3f)]
                     + lVar18 + 8);
        if ((local_c8.sh[3] != (shellface)0x0) &&
           (local_c8.sh[(ulong)(local_c8.shver & 1) + 9] == (shellface)0x0)) break;
        bVar8 = (long)uVar15 < 2;
        uVar15 = uVar1;
        if (bVar8) {
          paVar12->objects = uVar1;
          goto LAB_00134a1b;
        }
      }
      paVar12->objects = uVar15 - 1;
      puVar2 = (uint *)((long)local_c8.sh + (long)this->shmarkindex * 4 + 4);
      *puVar2 = *puVar2 | 2;
      pcVar13 = arraypool::getblock(this_00,(int)this_00->objects);
      uVar15 = this_00->objects;
      lVar19 = (long)this_00->objectbytes * ((long)this_00->objectsperblock - 1U & uVar15);
      lVar18 = uVar15 + 1;
      this_00->objects = lVar18;
      *(shellface **)(pcVar13 + lVar19) = local_c8.sh;
      *(int *)(pcVar13 + lVar19 + 8) = local_c8.shver;
      if (-1 < (long)uVar15) {
        lVar19 = 0;
        do {
          pcVar13 = this_00->toparray[(uint)lVar19 >> ((byte)this_00->log2objectsperblock & 0x1f)];
          lVar18 = (long)this_00->objectbytes *
                   (long)(int)(this_00->objectsperblockmark & (uint)lVar19);
          iVar21 = 3;
          do {
            if (*(long *)(*(long *)(pcVar13 + lVar18) + 0x30 +
                         (long)(*(int *)(pcVar13 + lVar18 + 8) >> 1) * 8) == 0) {
              uVar15 = *(ulong *)(*(long *)(pcVar13 + lVar18) +
                                 (long)(*(int *)(pcVar13 + lVar18 + 8) >> 1) * 8);
              uVar17 = (uint)uVar15;
              local_c8.shver = uVar17 & 7;
              local_c8.sh = (shellface *)(uVar15 & 0xfffffffffffffff8);
              uVar4 = *(uint *)((long)local_c8.sh + (long)this->shmarkindex * 4 + 4);
              if (((uVar4 & 2) == 0) && (local_c8.sh[(ulong)(uVar17 & 1) + 9] == (shellface)0x0)) {
                *(uint *)((long)local_c8.sh + (long)this->shmarkindex * 4 + 4) = uVar4 | 2;
                pcVar14 = arraypool::getblock(this_00,(int)this_00->objects);
                lVar20 = (long)this_00->objectbytes *
                         ((long)this_00->objectsperblock - 1U & this_00->objects);
                this_00->objects = this_00->objects + 1;
                *(shellface **)(pcVar14 + lVar20) = local_c8.sh;
                *(int *)(pcVar14 + lVar20 + 8) = local_c8.shver;
              }
            }
            *(int *)(pcVar13 + lVar18 + 8) = snextpivot[*(int *)(pcVar13 + lVar18 + 8)];
            iVar21 = iVar21 + -1;
          } while (iVar21 != 0);
          lVar19 = lVar19 + 1;
          lVar18 = this_00->objects;
        } while (lVar19 < lVar18);
      }
      paVar12 = local_78;
      paVar11 = local_b8;
      if (0 < lVar18) {
        ppcVar5 = *local_48;
        lVar19 = 0;
        do {
          puVar2 = (uint *)(*(long *)(ppcVar5[(uint)lVar19 >>
                                              ((byte)this_00->log2objectsperblock & 0x1f)] +
                                     (long)this_00->objectbytes *
                                     (long)(int)(this_00->objectsperblockmark & (uint)lVar19)) + 4 +
                           (long)this->shmarkindex * 4);
          *puVar2 = *puVar2 & 0xfffffffd;
          lVar19 = lVar19 + 1;
        } while (lVar18 != lVar19);
      }
      if (1 < this->b->verbose) {
        printf("    Recovering facet #%d: %ld subfaces.\n",(ulong)((int)local_70 + 1));
      }
      while( true ) {
        if (this_00->objects < 1) break;
        uVar15 = this_00->objects - 1;
        this_00->objects = uVar15;
        lVar18 = (long)this_00->objectbytes * ((long)this_00->objectsperblockmark & uVar15);
        local_c8.sh = *(shellface **)
                       (this_00->toparray[uVar15 >> ((byte)this_00->log2objectsperblock & 0x3f)] +
                       lVar18);
        local_c8.shver =
             *(int *)(this_00->toparray[uVar15 >> ((byte)this_00->log2objectsperblock & 0x3f)] +
                     lVar18 + 8);
        if ((local_c8.sh[3] != (shellface)0x0) &&
           (local_c8.sh[(ulong)(local_c8.shver & 1) + 9] == (shellface)0x0)) {
          local_98.tet = (tetrahedron *)0x0;
          iVar21 = scoutsubface(this,&local_c8,&local_98,1);
          paVar6 = local_a0;
          if (iVar21 == 0) {
            formregion(this,&local_c8,paVar12,local_a0,paVar11);
            iVar21 = scoutcrossedge(this,&local_98,paVar6,paVar12);
            if (iVar21 == 0) {
              bVar8 = true;
              if (0 < paVar12->objects) {
                lVar18 = 0;
                do {
                  pcVar13 = paVar12->toparray
                            [(uint)lVar18 >> ((byte)paVar12->log2objectsperblock & 0x1f)];
                  lVar20 = (long)paVar12->objectbytes *
                           (long)(int)(paVar12->objectsperblockmark & (uint)lVar18);
                  pcVar14 = arraypool::getblock(this_00,(int)this_00->objects);
                  lVar19 = (long)this_00->objectbytes *
                           ((long)this_00->objectsperblock - 1U & this_00->objects);
                  this_00->objects = this_00->objects + 1;
                  *(undefined8 *)(pcVar14 + lVar19) = *(undefined8 *)(pcVar13 + lVar20);
                  *(undefined4 *)(pcVar14 + lVar19 + 8) = *(undefined4 *)(pcVar13 + lVar20 + 8);
                  lVar18 = lVar18 + 1;
                } while (lVar18 < paVar12->objects);
                goto LAB_00134927;
              }
            }
            else {
              local_58.tet = local_98.tet;
              local_58.ver = local_98.ver;
              paVar24 = toppoints;
              bVar8 = formcavity(this,&local_98,paVar12,crosstets,topfaces,local_a8,toppoints,
                                 botpoints);
              paVar6 = local_88;
              if (bVar8) {
                if (this->b->flipinsert == 0) {
                  delaunizecavity(this,toppoints,topfaces,local_b0,local_80,crosstets,local_88);
                  botnewtets = local_60;
                  botshells = local_68;
                  delaunizecavity(this,botpoints,local_a8,local_68,local_60,crosstets,paVar6);
                  paVar11 = local_80;
                  paVar24 = botnewtets;
                  bVar9 = fillcavity(this,local_b0,botshells,local_88,paVar12,local_80,botnewtets,
                                     &local_58);
                  if (bVar9) {
                    carvecavity(this,crosstets,paVar11,botnewtets);
                  }
                  else {
                    restorecavity(this,crosstets,paVar11,botnewtets,local_a0);
                  }
                  bVar8 = false;
                  paVar11 = local_b8;
                  if (!bVar9) goto LAB_0013492c;
                }
                else {
                  flipinsertfacet(this,crosstets,toppoints,botpoints,paVar11);
                  if (0 < paVar12->objects) {
                    lVar18 = 0;
                    do {
                      pcVar13 = paVar12->toparray
                                [(uint)lVar18 >> ((byte)paVar12->log2objectsperblock & 0x1f)];
                      lVar20 = (long)paVar12->objectbytes *
                               (long)(int)(paVar12->objectsperblockmark & (uint)lVar18);
                      pcVar14 = arraypool::getblock(this_00,(int)this_00->objects);
                      lVar19 = (long)this_00->objectbytes *
                               ((long)this_00->objectsperblock - 1U & this_00->objects);
                      this_00->objects = this_00->objects + 1;
                      *(undefined8 *)(pcVar14 + lVar19) = *(undefined8 *)(pcVar13 + lVar20);
                      *(undefined4 *)(pcVar14 + lVar19 + 8) = *(undefined4 *)(pcVar13 + lVar20 + 8);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 < paVar12->objects);
                  }
                  crosstets->objects = 0;
                  topfaces->objects = 0;
                  local_a8->objects = 0;
                  toppoints->objects = 0;
                  botpoints->objects = 0;
                }
                paVar12 = this->caveencshlist;
                if (0 < paVar12->objects) {
                  lVar18 = 0;
                  do {
                    pfVar23 = (face *)(paVar12->toparray
                                       [(uint)lVar18 >> ((byte)paVar12->log2objectsperblock & 0x1f)]
                                      + (long)paVar12->objectbytes *
                                        (long)(int)(paVar12->objectsperblockmark & (uint)lVar18));
                    iVar21 = scoutsubface(this,pfVar23,&local_98,1);
                    if (iVar21 == 0) {
                      pcVar13 = arraypool::getblock(this_00,(int)this_00->objects);
                      lVar19 = (long)this_00->objectbytes *
                               ((long)this_00->objectsperblock - 1U & this_00->objects);
                      this_00->objects = this_00->objects + 1;
                      *(shellface **)(pcVar13 + lVar19) = pfVar23->sh;
                      *(int *)(pcVar13 + lVar19 + 8) = pfVar23->shver;
                    }
                    lVar18 = lVar18 + 1;
                    paVar12 = this->caveencshlist;
                  } while (lVar18 < paVar12->objects);
                }
                paVar12->objects = 0;
                paVar12 = this->caveencseglist;
                if (0 < paVar12->objects) {
                  lVar18 = 0;
                  do {
                    pcVar13 = paVar12->toparray
                              [(uint)lVar18 >> ((byte)paVar12->log2objectsperblock & 0x1f)];
                    lVar19 = (long)paVar12->objectbytes *
                             (long)(int)(paVar12->objectsperblockmark & (uint)lVar18);
                    pfVar23 = (face *)(pcVar13 + lVar19);
                    iVar10 = scoutsegment(this,*(point *)(*(long *)(pcVar13 + lVar19) +
                                                         (long)sorgpivot[*(int *)(pcVar13 +
                                                                                 lVar19 + 8)] * 8),
                                          *(point *)(*(long *)(pcVar13 + lVar19) +
                                                    (long)sdestpivot[*(int *)(pcVar13 + lVar19 + 8)]
                                                    * 8),pfVar23,&local_98,(point *)0x0,paVar24);
                    pppdVar7 = local_98.tet;
                    if (iVar10 != SHAREEDGE) {
                      puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
                      puts("  the message above, your input data set, and the exact");
                      puts("  command line you used to run this program, thank you.");
                      exit(2);
                    }
                    uVar15 = (ulong)local_98.ver;
                    pfVar23->sh[9] = (shellface)(uVar15 | (ulong)local_98.tet);
                    pppdVar22 = local_98.tet;
                    do {
                      if (pppdVar22[8] == (tetrahedron)0x0) {
                        ppdVar16 = (tetrahedron)memorypool::alloc(this->tet2segpool);
                        pppdVar22[8] = ppdVar16;
                        lVar19 = 0;
                        do {
                          pppdVar22[8][lVar19] = (double *)0x0;
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 6);
                      }
                      iVar21 = (int)uVar15;
                      pppdVar22[8][ver2edge[iVar21]] =
                           (double *)((long)pfVar23->shver | (ulong)pfVar23->sh);
                      pppdVar3 = pppdVar22 + facepivot1[iVar21];
                      pppdVar22 = (tetrahedron *)((ulong)*pppdVar3 & 0xfffffffffffffff0);
                      uVar15 = (ulong)(uint)facepivot2[iVar21][(uint)*pppdVar3 & 0xf];
                    } while (pppdVar7 != pppdVar22);
                    lVar18 = lVar18 + 1;
                    paVar12 = this->caveencseglist;
                  } while (lVar18 < paVar12->objects);
                }
                paVar12->objects = 0;
                paVar12 = local_78;
LAB_00134927:
                bVar8 = true;
                paVar11 = local_b8;
              }
            }
LAB_0013492c:
            lVar18 = paVar11->objects;
            if (0 < lVar18) {
              ppcVar5 = *local_38;
              lVar19 = 0;
              do {
                puVar2 = (uint *)(*(long *)(ppcVar5[(uint)lVar19 >>
                                                    ((byte)paVar11->log2objectsperblock & 0x1f)] +
                                           (long)paVar11->objectbytes *
                                           (long)(int)(paVar11->objectsperblockmark & (uint)lVar19))
                                  + 4 + (long)this->pointmarkindex * 4);
                *puVar2 = *puVar2 & 0xfffffffd;
                lVar19 = lVar19 + 1;
              } while (lVar18 != lVar19);
            }
            paVar11->objects = 0;
            local_a0->objects = 0;
            paVar12->objects = 0;
            if (bVar8 == false) {
              refineregion(this,local_40,toppoints,topfaces,local_b0,local_80,crosstets,local_88);
            }
          }
        }
      }
      local_70 = (ulong)((int)local_70 + 1);
      paVar12 = this->subfacstack;
      uVar15 = paVar12->objects;
    } while (0 < (long)uVar15);
  }
LAB_00134a1b:
  paVar24 = local_60;
  paVar12 = local_80;
  paVar6 = local_88;
  this->totalworkmemory =
       this->totalworkmemory +
       local_80->totalmemory + crosstets->totalmemory + local_60->totalmemory +
       topfaces->totalmemory + local_a8->totalmemory + local_88->totalmemory +
       toppoints->totalmemory + botpoints->totalmemory + this_00->totalmemory +
       local_b0->totalmemory + local_68->totalmemory + local_78->totalmemory + local_a0->totalmemory
       + paVar11->totalmemory + this->encseglist->totalmemory;
  arraypool::~arraypool(crosstets);
  operator_delete(crosstets,0x30);
  arraypool::~arraypool(paVar12);
  operator_delete(paVar12,0x30);
  arraypool::~arraypool(paVar24);
  operator_delete(paVar24,0x30);
  arraypool::~arraypool(topfaces);
  operator_delete(topfaces,0x30);
  paVar12 = local_a8;
  arraypool::~arraypool(local_a8);
  operator_delete(paVar12,0x30);
  arraypool::~arraypool(paVar6);
  operator_delete(paVar6,0x30);
  arraypool::~arraypool(toppoints);
  operator_delete(toppoints,0x30);
  arraypool::~arraypool(botpoints);
  operator_delete(botpoints,0x30);
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  paVar12 = local_b0;
  arraypool::~arraypool(local_b0);
  operator_delete(paVar12,0x30);
  paVar12 = local_68;
  arraypool::~arraypool(local_68);
  operator_delete(paVar12,0x30);
  paVar12 = local_78;
  arraypool::~arraypool(local_78);
  operator_delete(paVar12,0x30);
  paVar12 = local_a0;
  arraypool::~arraypool(local_a0);
  operator_delete(paVar12,0x30);
  paVar12 = local_b8;
  arraypool::~arraypool(local_b8);
  operator_delete(paVar12,0x30);
  paVar12 = this->encseglist;
  if (paVar12 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar12);
    operator_delete(paVar12,0x30);
  }
  this->encseglist = (arraypool *)0x0;
  return;
}

Assistant:

void tetgenmesh::constrainedfacets()
{
  arraypool *tg_crosstets, *tg_topnewtets, *tg_botnewtets;
  arraypool *tg_topfaces, *tg_botfaces, *tg_midfaces;
  arraypool *tg_topshells, *tg_botshells, *tg_facfaces; 
  arraypool *tg_toppoints, *tg_botpoints;
  arraypool *tg_missingshs, *tg_missingshbds, *tg_missingshverts;
  triface searchtet, neightet, crossedge;
  face searchsh, *parysh, *parysh1;
  face *paryseg;
  point *parypt;
  enum interresult dir;
  int facetcount;
  int success;
  int t1ver;
  int i, j;

  // Initialize arrays.
  tg_crosstets      = new arraypool(sizeof(triface), 10);
  tg_topnewtets     = new arraypool(sizeof(triface), 10);
  tg_botnewtets     = new arraypool(sizeof(triface), 10);
  tg_topfaces       = new arraypool(sizeof(triface), 10);
  tg_botfaces       = new arraypool(sizeof(triface), 10);
  tg_midfaces       = new arraypool(sizeof(triface), 10);
  tg_toppoints      = new arraypool(sizeof(point), 8);
  tg_botpoints      = new arraypool(sizeof(point), 8);
  tg_facfaces       = new arraypool(sizeof(face), 10);
  tg_topshells      = new arraypool(sizeof(face), 10);
  tg_botshells      = new arraypool(sizeof(face), 10);
  tg_missingshs     = new arraypool(sizeof(face), 10);
  tg_missingshbds   = new arraypool(sizeof(face), 10);
  tg_missingshverts = new arraypool(sizeof(point), 8);
  // This is a global array used by refineregion().
  encseglist        = new arraypool(sizeof(face), 4);

  facetcount = 0;

  while (subfacstack->objects > 0l) {

    subfacstack->objects--;
    parysh = (face *) fastlookup(subfacstack, subfacstack->objects);
    searchsh = *parysh;

    if (searchsh.sh[3] == NULL) continue; // It is dead.
    if (isshtet(searchsh)) continue; // It is recovered.

    // Collect all unrecovered subfaces which are co-facet.
    smarktest(searchsh);
    tg_facfaces->newindex((void **) &parysh);
    *parysh = searchsh;
    for (i = 0; i < tg_facfaces->objects; i++) {
      parysh = (face *) fastlookup(tg_facfaces, i);
      for (j = 0; j < 3; j++) {
        if (!isshsubseg(*parysh)) {
          spivot(*parysh, searchsh);
          if (!smarktested(searchsh)) {
            if (!isshtet(searchsh)) {
              smarktest(searchsh);
              tg_facfaces->newindex((void **) &parysh1);
              *parysh1 = searchsh;
            }
          }
        }
        senextself(*parysh);
      } // j
    } // i
    // Have found all facet subfaces. Unmark them.
    for (i = 0; i < tg_facfaces->objects; i++) {
      parysh = (face *) fastlookup(tg_facfaces, i);
      sunmarktest(*parysh);
    }

    if (b->verbose > 1) {
      printf("    Recovering facet #%d: %ld subfaces.\n", facetcount + 1, 
             tg_facfaces->objects);
    }
    facetcount++;

    while (tg_facfaces->objects > 0l) {

      tg_facfaces->objects--;
      parysh = (face *) fastlookup(tg_facfaces, tg_facfaces->objects);
      searchsh = *parysh;

      if (searchsh.sh[3] == NULL) continue; // It is dead.
      if (isshtet(searchsh)) continue; // It is recovered.

      searchtet.tet = NULL;
      if (scoutsubface(&searchsh, &searchtet, 1)) continue;

      // The subface is missing. Form the missing region.
      //   Re-use 'tg_crosstets' for 'adjtets'.
      formregion(&searchsh, tg_missingshs, tg_missingshbds, tg_missingshverts);

      if (scoutcrossedge(searchtet, tg_missingshbds, tg_missingshs)) {
        // Save this crossing edge, will be used by fillcavity().
        crossedge = searchtet;
        // Form a cavity of crossing tets.
        success = formcavity(&searchtet, tg_missingshs, tg_crosstets,
                             tg_topfaces, tg_botfaces, tg_toppoints,
                             tg_botpoints);
        if (success) {
          if (!b->flipinsert) {
            // Tetrahedralize the top part. Re-use 'tg_midfaces'.
            delaunizecavity(tg_toppoints, tg_topfaces, tg_topshells,
                            tg_topnewtets, tg_crosstets, tg_midfaces);
            // Tetrahedralize the bottom part. Re-use 'tg_midfaces'.
            delaunizecavity(tg_botpoints, tg_botfaces, tg_botshells,
                            tg_botnewtets, tg_crosstets, tg_midfaces);
            // Fill the cavity with new tets.
            success = fillcavity(tg_topshells, tg_botshells, tg_midfaces,
                                 tg_missingshs, tg_topnewtets, tg_botnewtets,
                                 &crossedge);
            if (success) {
              // Cavity is remeshed. Delete old tets and outer new tets.
              carvecavity(tg_crosstets, tg_topnewtets, tg_botnewtets);
            } else {
              restorecavity(tg_crosstets, tg_topnewtets, tg_botnewtets,
                            tg_missingshbds);
            }
          } else {
            // Use the flip algorithm of Shewchuk to recover the subfaces.
            flipinsertfacet(tg_crosstets, tg_toppoints, tg_botpoints, 
                            tg_missingshverts);
			// Put all subfaces in R back to tg_facfaces.
		    for (i = 0; i < tg_missingshs->objects; i++) {
		      parysh = (face *) fastlookup(tg_missingshs, i);
		      tg_facfaces->newindex((void **) &parysh1);
              *parysh1 = *parysh;
		    }
			success = 1;
            // Clear working lists.
            tg_crosstets->restart();
            tg_topfaces->restart();
            tg_botfaces->restart();
            tg_toppoints->restart();
            tg_botpoints->restart();
          } // b->flipinsert

          if (success) {
            // Recover interior subfaces.
            for (i = 0; i < caveencshlist->objects; i++) {
              parysh = (face *) fastlookup(caveencshlist, i);
              if (!scoutsubface(parysh, &searchtet, 1)) {
                // Add this face at the end of the list, so it will be
                //   processed immediately.
                tg_facfaces->newindex((void **) &parysh1);
                *parysh1 = *parysh;
              }
            }
            caveencshlist->restart();
            // Recover interior segments. This should always be recovered.
            for (i = 0; i < caveencseglist->objects; i++) {
              paryseg = (face *) fastlookup(caveencseglist, i);
              dir = scoutsegment(sorg(*paryseg), sdest(*paryseg), paryseg,
                                 &searchtet, NULL, NULL);
              if (dir != SHAREEDGE) {
                terminatetetgen(this, 2);
              }
              // Insert this segment.
              // Let the segment remember an adjacent tet.
              sstbond1(*paryseg, searchtet);
              // Bond the segment to all tets containing it.
              neightet = searchtet;
              do {
                tssbond1(neightet, *paryseg);
                fnextself(neightet);
              } while (neightet.tet != searchtet.tet);
            }
            caveencseglist->restart();
          } // success - remesh cavity
        } // success - form cavity
      } else {
        // Put all subfaces in R back to tg_facfaces.
		for (i = 0; i < tg_missingshs->objects; i++) {
		  parysh = (face *) fastlookup(tg_missingshs, i);
		  tg_facfaces->newindex((void **) &parysh1);
          *parysh1 = *parysh;
		}
		success = 1;
      } // if (scoutcrossedge)

      // Unmarktest all points of the missing region.
      for (i = 0; i < tg_missingshverts->objects; i++) {
        parypt = (point *) fastlookup(tg_missingshverts, i);
        punmarktest(*parypt);
      }
      tg_missingshverts->restart();
      tg_missingshbds->restart();
      tg_missingshs->restart();

      if (!success) {
        // The missing region can not be recovered. Refine it.
        refineregion(recentsh, tg_toppoints, tg_topfaces, tg_topshells,
                     tg_topnewtets, tg_crosstets, tg_midfaces);
      }
    } // while (tg_facfaces->objects)

  } // while ((subfacstack->objects)

  // Accumulate the dynamic memory.
  totalworkmemory += (tg_crosstets->totalmemory + tg_topnewtets->totalmemory +
                      tg_botnewtets->totalmemory + tg_topfaces->totalmemory +
                      tg_botfaces->totalmemory + tg_midfaces->totalmemory +
                      tg_toppoints->totalmemory + tg_botpoints->totalmemory +
                      tg_facfaces->totalmemory + tg_topshells->totalmemory +
                      tg_botshells->totalmemory + tg_missingshs->totalmemory +
                      tg_missingshbds->totalmemory + 
                      tg_missingshverts->totalmemory + 
                      encseglist->totalmemory);

  // Delete arrays.
  delete tg_crosstets;
  delete tg_topnewtets;
  delete tg_botnewtets;
  delete tg_topfaces;
  delete tg_botfaces;
  delete tg_midfaces;
  delete tg_toppoints;
  delete tg_botpoints;
  delete tg_facfaces;
  delete tg_topshells;
  delete tg_botshells;
  delete tg_missingshs;
  delete tg_missingshbds;
  delete tg_missingshverts;
  delete encseglist;
  encseglist = NULL;
}